

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beatnik.hpp
# Opt level: O3

bool __thiscall
re::beatnik::beatnik<float,_1024L,_128L,_2048L,_128L>::process
          (beatnik<float,_1024L,_128L,_2048L,_128L> *this,span<const_float,_128L> audio)

{
  container_iterator pvVar1;
  tracker<float,_256L,_4L> *this_00;
  container_iterator pvVar2;
  long lVar3;
  span<const_float,_2048L> input;
  ulong uVar4;
  bool bVar5;
  value_type value_copy;
  float odf_value;
  
  odf_value = onset_detector<float,1024l>::process<128l>((onset_detector<float,1024l> *)this,audio);
  pvVar2 = (this->odf_buffer).next;
  pvVar1 = pvVar2 + 1;
  (this->odf_buffer).next = pvVar1;
  *pvVar2 = odf_value;
  if (pvVar1 == &this->frames_per_minute) {
    (this->odf_buffer).next = (this->odf_buffer).c._M_elems;
  }
  this_00 = &this->tracker_;
  tracker<float,_256L,_4L>::update_score(this_00,odf_value);
  lVar3 = this->counter;
  this->counter = lVar3 + 1;
  if (lVar3 < 0x7f) {
    uVar4 = this_00->period_guess;
    bVar5 = (uVar4 & 0xffffffffffffff00) == 0x100;
  }
  else {
    this->counter = 0;
    input.storage_.data_ =
         (storage_type<gsl::details::extent_type<2048L>_>)
         ring_array<float,_2048UL>::linearize(&this->odf_buffer);
    uVar4 = decoder<float,_2048L,_4L>::calculate_period(&this->decoder_,input);
    if ((uVar4 & 0xffffffffffffff00) != 0x100) {
      __assert_fail("is_valid_period(period)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/reBass[P]libbeatnik/include/re/beatnik/tracker/tracker.hpp"
                    ,0x1e,
                    "void re::beatnik::tracker<float, 256, 4>::set_period_guess(int_t) [T = float, MinPeriod = 256, BeatsCount = 4]"
                   );
    }
    this_00->period_guess = uVar4;
    bVar5 = true;
  }
  return (bool)((long)uVar4 < (this->tracker_).counter & bVar5);
}

Assistant:

bool
    process(gsl::span<float_t const, fft_step> audio) noexcept
    {
        float_t sample = onset_detector_.process(audio);
        odf_buffer.push_back(sample);
        tracker_.update_score(sample);

        if (++counter >= odf_step) {
            counter = 0;
            tracker_.set_period_guess(
                decoder_.calculate_period(odf_buffer.linearize())
            );
        }

        return tracker_.new_estimate_expected();
    }